

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeNaN.cpp
# Opt level: O0

Pass * wasm::createDeNaNPass(void)

{
  DeNaN *this;
  
  this = (DeNaN *)operator_new(0x1d0);
  memset(this,0,0x1d0);
  DeNaN::DeNaN(this);
  return (Pass *)this;
}

Assistant:

Pass* createDeNaNPass() { return new DeNaN(); }